

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_CreateProperty(JSContext *ctx,JSObject *p,JSAtom prop,JSValue val,JSValue getter,
                     JSValue setter,int flags)

{
  byte bVar1;
  ushort uVar2;
  JSClassExoticMethods *pJVar3;
  _func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_JSValue_int *p_Var4;
  JSValue *pval;
  BOOL BVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  JSRefCountHeader *p_4;
  JSValueUnion *pJVar9;
  JSValueUnion JVar10;
  int64_t iVar11;
  char *fmt;
  JSRefCountHeader *p_3;
  JSValueUnion JVar12;
  JSRefCountHeader *p_2;
  JSValue JVar13;
  JSValue obj;
  JSValue new_val;
  uint32_t idx;
  uint32_t len;
  JSValueUnion local_40;
  JSValueUnion local_38;
  
  JVar12 = (JSValueUnion)val.tag;
  local_40 = val.u;
  bVar1 = (p->field_0).header.dummy1;
  iVar7 = -1;
  if ((bVar1 & 4) == 0) {
LAB_0011c2c2:
    if (((p->field_0).header.dummy1 & 1) != 0) {
      uVar6 = flags & 7;
      if ((flags & 0x1800U) != 0) {
        uVar6 = flags & 5U | 0x10;
      }
      pJVar9 = (JSValueUnion *)add_property(ctx,p,prop,uVar6);
      if (pJVar9 != (JSValueUnion *)0x0) {
        if ((flags & 0x1800U) == 0) {
          if (((uint)flags >> 0xd & 1) == 0) {
            pJVar9->int32 = 0;
            pJVar9[1].float64 = 1.48219693752374e-323;
          }
          else {
            if (0xfffffff4 < (uint)JVar12.int32) {
              *(int *)local_40.ptr = *local_40.ptr + 1;
            }
            pJVar9->ptr = (void *)local_40;
            pJVar9[1] = JVar12;
          }
          iVar7 = 1;
        }
        else {
          pJVar9->float64 = 0.0;
          if ((((uint)flags >> 0xb & 1) != 0) && (iVar7 = JS_IsFunction(ctx,getter), iVar7 != 0)) {
            if (0xfffffff4 < (uint)getter.tag) {
              *(int *)getter.u.ptr = *getter.u.ptr + 1;
            }
            *pJVar9 = getter.u;
          }
          pJVar9[1].float64 = 0.0;
          iVar7 = 1;
          if ((((uint)flags >> 0xc & 1) != 0) && (iVar8 = JS_IsFunction(ctx,setter), iVar8 != 0)) {
            if (0xfffffff4 < (uint)setter.tag) {
              *(int *)setter.u.ptr = *setter.u.ptr + 1;
            }
            pJVar9[1] = setter.u;
          }
        }
      }
      return iVar7;
    }
  }
  else {
    uVar2 = (p->field_0).header.dummy2;
    if ((ulong)uVar2 == 2) {
      local_38 = JVar12;
      if ((bVar1 & 8) == 0) {
        BVar5 = JS_AtomIsArrayIndex(ctx,&idx,prop);
        JVar12 = local_38;
        if (BVar5 == 0) goto LAB_0011c2c2;
      }
      else {
        if ((int)prop < 0) {
          idx = prop & 0x7fffffff;
          if (idx == (p->u).array.count) {
            if ((bVar1 & 1) == 0) goto LAB_0011c2c9;
            if (((flags & 0x1800U) == 0) && ((~((uint)flags >> 8 & flags) & 7) == 0)) {
              if (0xfffffff4 < (uint)val.tag) {
                *(int *)local_40.ptr = *local_40.ptr + 1;
              }
              iVar7 = add_fast_array_element(ctx,p,val,flags);
              return iVar7;
            }
          }
        }
        else {
          BVar5 = JS_AtomIsArrayIndex(ctx,&idx,prop);
          JVar12 = local_38;
          if (BVar5 == 0) goto LAB_0011c2c2;
        }
        iVar8 = convert_fast_array_to_array(ctx,p);
        if (iVar8 != 0) {
          return -1;
        }
      }
      pval = (JSValue *)p->prop;
      JS_ToInt32(ctx,(int32_t *)&len,*pval);
      uVar6 = idx + 1;
      JVar12 = local_38;
      if (len < uVar6) {
        if ((p->shape[1].header.ref_count & 0x8000000) == 0) {
          iVar7 = JS_ThrowTypeErrorReadOnly(ctx,flags,0x30);
          return iVar7;
        }
        JVar10._4_4_ = 0;
        JVar10.int32 = uVar6;
        JVar12.float64 = (double)JVar10.float64;
        if (-1 < (int)uVar6) {
          JVar12 = JVar10;
        }
        iVar11 = 7;
        if (-1 < (int)uVar6) {
          iVar11 = 0;
        }
        new_val.tag = iVar11;
        new_val.u.float64 = JVar12.float64;
        len = uVar6;
        set_value(ctx,pval,new_val);
        JVar12 = local_38;
      }
      goto LAB_0011c2c2;
    }
    if ((ushort)(uVar2 - 0x15) < 9) {
      iVar8 = JS_AtomIsNumericIndex(ctx,prop);
      if (iVar8 != 0) {
        if (iVar8 < 0) {
          return -1;
        }
        fmt = "cannot create numeric index in typed array";
        goto LAB_0011c2d0;
      }
      goto LAB_0011c2c2;
    }
    if ((((uint)flags >> 0x11 & 1) != 0) ||
       (pJVar3 = ctx->rt->class_array[uVar2].exotic, pJVar3 == (JSClassExoticMethods *)0x0))
    goto LAB_0011c2c2;
    p_Var4 = pJVar3->define_own_property;
    if (p_Var4 != (_func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_JSValue_int *)0x0) {
      JVar13.tag = -1;
      JVar13.u.ptr = p;
      iVar7 = (*p_Var4)(ctx,JVar13,prop,val,getter,setter,flags);
      return iVar7;
    }
    obj.tag = -1;
    obj.u.ptr = p;
    iVar8 = JS_IsExtensible(ctx,obj);
    if (iVar8 < 0) {
      return -1;
    }
    if (iVar8 != 0) goto LAB_0011c2c2;
  }
LAB_0011c2c9:
  fmt = "object is not extensible";
LAB_0011c2d0:
  iVar7 = JS_ThrowTypeErrorOrFalse(ctx,flags,fmt);
  return iVar7;
}

Assistant:

static int JS_CreateProperty(JSContext *ctx, JSObject *p,
                             JSAtom prop, JSValueConst val,
                             JSValueConst getter, JSValueConst setter,
                             int flags)
{
    JSProperty *pr;
    int ret, prop_flags;

    /* add a new property or modify an existing exotic one */
    if (p->is_exotic) {
        if (p->class_id == JS_CLASS_ARRAY) {
            uint32_t idx, len;

            if (p->fast_array) {
                if (__JS_AtomIsTaggedInt(prop)) {
                    idx = __JS_AtomToUInt32(prop);
                    if (idx == p->u.array.count) {
                        if (!p->extensible)
                            goto not_extensible;
                        if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET))
                            goto convert_to_array;
                        prop_flags = get_prop_flags(flags, 0);
                        if (prop_flags != JS_PROP_C_W_E)
                            goto convert_to_array;
                        return add_fast_array_element(ctx, p,
                                                      JS_DupValue(ctx, val), flags);
                    } else {
                        goto convert_to_array;
                    }
                } else if (JS_AtomIsArrayIndex(ctx, &idx, prop)) {
                    /* convert the fast array to normal array */
                convert_to_array:
                    if (convert_fast_array_to_array(ctx, p))
                        return -1;
                    goto generic_array;
                }
            } else if (JS_AtomIsArrayIndex(ctx, &idx, prop)) {
                JSProperty *plen;
                JSShapeProperty *pslen;
            generic_array:
                /* update the length field */
                plen = &p->prop[0];
                JS_ToUint32(ctx, &len, plen->u.value);
                if ((idx + 1) > len) {
                    pslen = get_shape_prop(p->shape);
                    if (unlikely(!(pslen->flags & JS_PROP_WRITABLE)))
                        return JS_ThrowTypeErrorReadOnly(ctx, flags, JS_ATOM_length);
                    /* XXX: should update the length after defining
                       the property */
                    len = idx + 1;
                    set_value(ctx, &plen->u.value, JS_NewUint32(ctx, len));
                }
            }
        } else if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                   p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            ret = JS_AtomIsNumericIndex(ctx, prop);
            if (ret != 0) {
                if (ret < 0)
                    return -1;
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "cannot create numeric index in typed array");
            }
        } else if (!(flags & JS_PROP_NO_EXOTIC)) {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em) {
                if (em->define_own_property) {
                    return em->define_own_property(ctx, JS_MKPTR(JS_TAG_OBJECT, p),
                                                   prop, val, getter, setter, flags);
                }
                ret = JS_IsExtensible(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
                if (ret < 0)
                    return -1;
                if (!ret)
                    goto not_extensible;
            }
        }
    }

    if (!p->extensible) {
    not_extensible:
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "object is not extensible");
    }

    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
        prop_flags = (flags & (JS_PROP_CONFIGURABLE | JS_PROP_ENUMERABLE)) |
            JS_PROP_GETSET;
    } else {
        prop_flags = flags & JS_PROP_C_W_E;
    }
    pr = add_property(ctx, p, prop, prop_flags);
    if (unlikely(!pr))
        return -1;
    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
        pr->u.getset.getter = NULL;
        if ((flags & JS_PROP_HAS_GET) && JS_IsFunction(ctx, getter)) {
            pr->u.getset.getter =
                JS_VALUE_GET_OBJ(JS_DupValue(ctx, getter));
        }
        pr->u.getset.setter = NULL;
        if ((flags & JS_PROP_HAS_SET) && JS_IsFunction(ctx, setter)) {
            pr->u.getset.setter =
                JS_VALUE_GET_OBJ(JS_DupValue(ctx, setter));
        }
    } else {
        if (flags & JS_PROP_HAS_VALUE) {
            pr->u.value = JS_DupValue(ctx, val);
        } else {
            pr->u.value = JS_UNDEFINED;
        }
    }
    return TRUE;
}